

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDriverGetIpcProperties
          (ze_driver_handle_t hDriver,ze_driver_ipc_properties_t *pIpcProperties)

{
  ze_pfnDriverGetIpcProperties_t pfnGetIpcProperties;
  ze_result_t result;
  ze_driver_ipc_properties_t *pIpcProperties_local;
  ze_driver_handle_t hDriver_local;
  
  pfnGetIpcProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c1e8 != (code *)0x0) {
    pfnGetIpcProperties._4_4_ = (*DAT_0011c1e8)(hDriver,pIpcProperties);
  }
  return pfnGetIpcProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGetIpcProperties(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        ze_driver_ipc_properties_t* pIpcProperties      ///< [in,out] query result for IPC properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetIpcProperties = context.zeDdiTable.Driver.pfnGetIpcProperties;
        if( nullptr != pfnGetIpcProperties )
        {
            result = pfnGetIpcProperties( hDriver, pIpcProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }